

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double chebyshev1_cdf(double x)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((-1.0 <= x) && (dVar1 = 1.0, x <= 1.0)) {
    dVar1 = asin(x);
    dVar1 = dVar1 / 3.141592653589793 + 0.5;
  }
  return dVar1;
}

Assistant:

double chebyshev1_cdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_CDF evaluates the Chebyshev1 CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Output, double CHEBYSHEV1_CDF, the value of the CDF.
//
{
  double cdf;
  const double r8_pi = 3.14159265358979323;

  if ( x < -1.0 )
  {
    cdf = 0.0;
  }
  else if ( 1.0 < x )
  {
    cdf = 1.0;
  }
  else
  {
    cdf = 0.5 + asin ( x ) / r8_pi;
  }

  return cdf;
}